

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.c
# Opt level: O3

ll_node * wal_read(sptr_t data,sptr_t palette)

{
  uint uVar1;
  int32_t iVar2;
  undefined4 uVar3;
  wal_dk_header *out;
  void *pvVar4;
  ulong uVar5;
  size_t sVar6;
  ll_node *plVar7;
  long lVar8;
  uchar *puVar9;
  size_t sVar10;
  uint uVar11;
  undefined4 uVar12;
  uchar *buffer;
  undefined4 uVar13;
  uint uVar14;
  undefined8 *puVar15;
  ulong uVar16;
  size_t sVar17;
  long lVar18;
  sptr_t sVar19;
  size_t local_308 [4];
  undefined1 local_2e8 [12];
  undefined4 local_2dc [3];
  undefined8 local_2d0 [2];
  undefined8 local_2c0 [82];
  
  sVar10 = palette.size;
  puVar9 = palette.ptr;
  buffer = data.ptr;
  if (data.size < 0x37c || buffer == (uchar *)0x0) {
    return (ll_node *)0x0;
  }
  iVar2 = wal_get_type(buffer);
  if (iVar2 == 2) {
    out = (wal_dk_header *)xmalloc(0x37c);
    wal_dk_read_header(buffer,out);
    if (puVar9 == (uchar *)0x0) {
      sVar10 = 0x300;
      puVar9 = out->palette;
    }
    lVar18 = 0;
    uVar16 = 1;
    uVar5 = (ulong)(out->height * out->width);
    do {
      sVar19 = sptr_slice(data,(ulong)out->offsets[lVar18],uVar5);
      sVar17 = sVar19.size;
      if (sVar19.ptr == (uchar *)0x0) goto LAB_00103d42;
      pvVar4 = xmalloc(sVar17);
      memcpy(pvVar4,sVar19.ptr,sVar17);
      uVar13 = 0;
      if (sVar17 != 0) {
        sVar6 = 0;
        do {
          if (*(char *)((long)pvVar4 + sVar6) == -1) {
            uVar13 = 1;
            break;
          }
          sVar6 = sVar6 + 1;
        } while (sVar17 != sVar6);
      }
      uVar12 = (undefined4)(out->width / uVar16);
      uVar14 = (uint)uVar16;
      if (out->width < uVar14) {
        uVar12 = 1;
      }
      uVar3 = (undefined4)(out->height / uVar16);
      if (out->height < uVar14) {
        uVar3 = 1;
      }
      lVar8 = lVar18 * 0x50;
      local_308[lVar18 * 10] = (size_t)pvVar4;
      local_308[lVar18 * 10 + 1] = sVar17;
      local_308[lVar18 * 10 + 2] = (size_t)puVar9;
      *(size_t *)(local_2e8 + lVar8 + -8) = sVar10;
      local_2e8[lVar8] = 1;
      local_2e8[lVar8 + 8] = 2;
      local_2dc[lVar18 * 0x14] = uVar12;
      local_2dc[lVar18 * 0x14 + 1] = uVar3;
      local_2d0[lVar18 * 10] = out;
      local_2c0[lVar18 * 10 + -1] = 0;
      *(undefined4 *)(local_2c0 + lVar18 * 10) = uVar13;
      sVar17 = uVar5 >> 2;
      if (uVar5 < 4) {
        sVar17 = 1;
      }
      uVar16 = (ulong)(uVar14 * 2);
      lVar18 = lVar18 + 1;
      uVar5 = sVar17;
    } while (lVar18 != 9);
    sVar10 = 9;
  }
  else {
    if (iVar2 != 1) {
      return (ll_node *)0x0;
    }
    out = (wal_dk_header *)xmalloc(100);
    wal_q2_read_header(buffer,(wal_q2_header *)out);
    lVar18 = 10;
    puVar15 = local_2c0;
    uVar5 = (ulong)(out->width * *(uint32_t *)(out->name + 0x1c));
    do {
      sVar19 = sptr_slice(data,(ulong)*(uint *)(out->padding + lVar18 * 4 + -1),uVar5);
      sVar17 = sVar19.size;
      if (sVar19.ptr == (uchar *)0x0) {
LAB_00103d42:
        free(out);
        return (ll_node *)0x0;
      }
      pvVar4 = xmalloc(sVar17);
      memcpy(pvVar4,sVar19.ptr,sVar17);
      uVar11 = (int)lVar18 - 9;
      uVar14 = *(uint *)(out->name + 0x1c);
      uVar1 = out->width;
      puVar15[-9] = pvVar4;
      puVar15[-8] = sVar17;
      puVar15[-7] = puVar9;
      puVar15[-6] = sVar10;
      *(undefined1 *)(puVar15 + -5) = 1;
      *(undefined1 *)(puVar15 + -4) = 1;
      *(uint *)((long)puVar15 + -0x1c) = uVar14 / uVar11;
      *(uint *)(puVar15 + -3) = uVar1 / uVar11;
      puVar15[-2] = out;
      puVar15[-1] = 0;
      *(undefined4 *)puVar15 = 0;
      sVar17 = uVar5 >> 2;
      if (uVar5 < 4) {
        sVar17 = 1;
      }
      puVar15 = puVar15 + 10;
      lVar18 = lVar18 + 1;
      uVar5 = sVar17;
    } while (lVar18 != 0xe);
    sVar10 = 4;
  }
  plVar7 = ll_from_array(local_308,0x50,sVar10);
  return plVar7;
}

Assistant:

struct ll_node *wal_read(const sptr_t data, const sptr_t palette)
{
	if (SPTR_IS_NULL(data)) {
		return NULL;
	}
	/* Daikatana header is bigger */
	if (data.size < WAL_DK_HEADER_SIZE) {
		return NULL;
	}
	switch (wal_get_type(data.ptr)) {
		case WAL_TYPE_QUAKE2:
			return wal_q2_read(data, palette);
		case WAL_TYPE_DAIKATANA:
			return wal_dk_read(data, palette);
		default:
			return NULL;
	}
}